

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O1

Tree flute_mr(int d,int *xs,int *ys,int *s,int acc,int rounds,int **dist,int *threshold_x,
             int *threshold_y,int *threshold,int *best_round,int *min_node1,int *min_node2,int **nb)

{
  size_t __n;
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  Branch *__ptr;
  dl_el_s *pdVar5;
  bool bVar8;
  dl_el *pdVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  dl_t paVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  Tree *__ptr_00;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  Tree TVar22;
  Tree TVar23;
  Tree t2;
  Branch *pBStack_3ec20;
  ulong uStack_3ec18;
  int iStack_3ebf4;
  uint uStack_3ebdc;
  int *order [110];
  int idx [500];
  int tree_id [500];
  int offset [500];
  int tree_size [500];
  int edges [1000];
  int subroot [500];
  int suproot [500];
  int y [1000];
  int x [1000];
  int isSuperRoot [500];
  int xmap [1000];
  int si [500];
  int new_s [1000];
  int order_base [55000];
  
  uVar17 = (ulong)(uint)d;
  if (-1 < d) {
    lVar20 = 0;
    do {
      paVar13 = dl_alloc();
      *(dl_t *)((long)ht + lVar20) = paVar13;
      lVar20 = lVar20 + 8;
    } while (uVar17 * 8 + 8 != lVar20);
  }
  piVar15 = order_base;
  lVar20 = 0;
  do {
    order[lVar20] = piVar15;
    lVar20 = lVar20 + 1;
    piVar15 = piVar15 + d;
  } while (lVar20 != 0x6e);
  if (rounds < 0) {
    uStack_3ec18 = 0x7fffffff;
    pBStack_3ec20 = (Branch *)0x0;
  }
  else {
    __n = uVar17 * 4;
    lVar20 = (long)(d * 2 + -2);
    uStack_3ec18 = 0x7fffffff;
    pBStack_3ec20 = (Branch *)0x0;
    do {
      if (0 < d) {
        memset(isSuperRoot,0,__n);
        memcpy(y,ys,__n);
        uVar14 = 0;
        do {
          x[uVar14] = xs[s[uVar14]];
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
      }
      if (rounds == FIRST_ROUND) {
        build_rmst((long)d,x,y,edges,tree_id);
        if (0 < d) {
          uVar14 = 0;
          do {
            dist[uVar14][uVar14] = 0;
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
        }
      }
      else {
        mst_from_heap(d,dist,*min_node1,*min_node2,nb,edges,tree_id);
      }
      if (rounds != 0) {
        iStack_3ebf4 = 0;
      }
      if (rounds != 0 && 0 < d) {
        uVar14 = 0;
        do {
          nb[uVar14][1] = 2;
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
        iStack_3ebf4 = 0;
      }
      if (1 < d) {
        lVar21 = 0;
        do {
          if (rounds != 0) {
            iVar12 = edges[lVar21];
            iVar1 = edges[lVar21 + 1];
            piVar15 = nb[iVar12];
            if (*piVar15 == piVar15[1]) {
              iVar2 = *piVar15 * 2 + 2;
              piVar15 = (int *)realloc(piVar15,(long)iVar2 * 4);
              nb[iVar12] = piVar15;
              *piVar15 = iVar2;
            }
            piVar15 = nb[iVar12];
            iVar2 = piVar15[1];
            piVar15[1] = iVar2 + 1;
            piVar15[iVar2] = iVar1;
            piVar15 = nb[iVar1];
            if (*piVar15 == piVar15[1]) {
              iVar2 = *piVar15 * 2 + 2;
              piVar15 = (int *)realloc(piVar15,(long)iVar2 * 4);
              nb[iVar1] = piVar15;
              *piVar15 = iVar2;
            }
            piVar15 = nb[iVar1];
            iVar2 = piVar15[1];
            piVar15[1] = iVar2 + 1;
            piVar15[iVar2] = iVar12;
            iVar10 = x[iVar12] - x[iVar1];
            iVar2 = -iVar10;
            if (0 < iVar10) {
              iVar2 = iVar10;
            }
            iVar11 = y[iVar12] - y[iVar1];
            iVar10 = -iVar11;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            iVar10 = iVar10 + iVar2;
            dist[iVar1][iVar12] = iVar10;
            dist[iVar12][iVar1] = iVar10;
            if (iStack_3ebf4 <= iVar10) {
              iStack_3ebf4 = iVar10;
            }
          }
          lVar21 = lVar21 + 2;
        } while (lVar21 < lVar20);
      }
      if (0 < d) {
        uVar14 = 0;
        do {
          tree_size[uVar14] = 1;
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
      }
      subroot[0] = edges[0];
      suproot[0] = edges[0];
      uVar19 = 1;
      lVar21 = (long)(d * 2 + -4) + 3;
      if (1 < d) {
        do {
          iVar12 = tree_size[lVar21 + 0x1f2];
          iVar1 = tree_size[lVar21 + 0x1f1];
          if ((double)acc * 1.3 + 8.0 <= (double)(tree_size[iVar12] + tree_size[iVar1])) {
            isSuperRoot[iVar1] = 1;
            suproot[(int)uVar19] = iVar1;
            subroot[(int)uVar19] = iVar12;
            uVar19 = uVar19 + 1;
          }
          else {
            tree_size[iVar1] = tree_size[iVar12] + tree_size[iVar1];
          }
          lVar21 = lVar21 + -2;
        } while (1 < lVar21);
      }
      uVar14 = (ulong)uVar19;
      if (1 < (int)uVar19) {
        uVar16 = 1;
        do {
          iVar12 = subroot[uVar16];
          uVar16 = uVar16 + 1;
          tree_id[iVar12] = (int)uVar16;
          tree_size[iVar12] = tree_size[iVar12] + 1;
        } while (uVar14 != uVar16);
      }
      if (1 < d) {
        lVar21 = 0;
        do {
          if (tree_id[edges[lVar21 + 1]] == 1) {
            tree_id[edges[lVar21 + 1]] = tree_id[edges[lVar21]];
          }
          lVar21 = lVar21 + 2;
        } while (lVar21 < lVar20);
      }
      if (0 < d) {
        uVar16 = 0;
        do {
          si[s[uVar16]] = (int)uVar16;
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      offset[1] = 0;
      if (1 < (int)uVar19) {
        iVar12 = 0;
        lVar21 = 0;
        do {
          iVar12 = iVar12 + tree_size[subroot[lVar21]];
          offset[lVar21 + 2] = iVar12;
          lVar21 = lVar21 + 1;
        } while (uVar14 - 1 != lVar21);
      }
      if (-1 < (int)uVar19) {
        memset(idx,0,uVar14 * 4 + 4);
      }
      if (0 < d) {
        uVar16 = 0;
        do {
          iVar12 = si[uVar16];
          iVar1 = tree_id[iVar12];
          iVar2 = idx[iVar1];
          idx[iVar1] = iVar2 + 1;
          iVar10 = xs[uVar16];
          x[(long)offset[iVar1] + (long)iVar2] = iVar10;
          xmap[uVar16] = iVar2;
          if (isSuperRoot[iVar12] != 0 && 1 < (int)uVar19) {
            lVar21 = 0;
            do {
              if (suproot[lVar21 + 1] == iVar12) {
                iVar1 = idx[lVar21 + 2];
                idx[lVar21 + 2] = iVar1 + 1;
                x[(long)offset[lVar21 + 2] + (long)iVar1] = iVar10;
                xmap[(int)lVar21 + d + 1] = iVar1;
              }
              lVar21 = lVar21 + 1;
            } while (uVar14 - 1 != lVar21);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar17);
      }
      if (-1 < (int)uVar19) {
        memset(idx,0,uVar14 * 4 + 4);
      }
      if (0 < d) {
        uVar16 = 0;
        do {
          lVar21 = (long)tree_id[uVar16];
          iVar12 = idx[lVar21];
          idx[lVar21] = iVar12 + 1;
          lVar18 = (long)offset[lVar21] + (long)iVar12;
          y[lVar18] = ys[uVar16];
          new_s[lVar18] = xmap[s[uVar16]];
          order[lVar21 + -1][iVar12] = (int)uVar16;
          if (isSuperRoot[uVar16] != 0 && 1 < (int)uVar19) {
            lVar21 = 0;
            do {
              if (uVar16 == (uint)suproot[lVar21 + 1]) {
                iVar12 = idx[lVar21 + 2];
                idx[lVar21 + 2] = iVar12 + 1;
                lVar18 = (long)offset[lVar21 + 2] + (long)iVar12;
                y[lVar18] = ys[uVar16];
                new_s[lVar18] = xmap[(int)lVar21 + d + 1];
                order[lVar21 + 1][iVar12] = (int)uVar16;
              }
              lVar21 = lVar21 + 1;
            } while (uVar14 - 1 != lVar21);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar17);
      }
      __ptr_00 = (Tree *)malloc((long)(int)uVar19 << 4);
      if (0 < (int)uVar19) {
        lVar21 = 0;
        do {
          if (tree_size[*(int *)((long)subroot + lVar21)] < 2) {
            (&__ptr_00->deg)[lVar21] = 0;
          }
          else {
            iVar12 = *(int *)((long)offset + lVar21 + 4);
            TVar22 = flutes_c(tree_size[*(int *)((long)subroot + lVar21)],x + iVar12,y + iVar12,
                              new_s + iVar12,acc);
            *(long *)(&__ptr_00->deg + lVar21) = TVar22._0_8_;
            *(Branch **)((long)&__ptr_00->branch + lVar21 * 4) = TVar22.branch;
          }
          lVar21 = lVar21 + 4;
        } while (uVar14 * 4 - lVar21 != 0);
      }
      if (1 < (int)uVar19) {
        uVar16 = 1;
        do {
          iVar12 = suproot[uVar16];
          lVar21 = (long)tree_id[iVar12];
          lVar18 = (long)tree_id[subroot[uVar16]];
          uVar3 = __ptr_00[lVar21 + -1].deg;
          uVar6 = __ptr_00[lVar21 + -1].length;
          TVar22.length = uVar6;
          TVar22.deg = uVar3;
          uVar4 = __ptr_00[lVar18 + -1].deg;
          uVar7 = __ptr_00[lVar18 + -1].length;
          t2.length = uVar7;
          t2.deg = uVar4;
          TVar22.branch = __ptr_00[lVar21 + -1].branch;
          t2.branch = __ptr_00[lVar18 + -1].branch;
          TVar22 = wmergetree(TVar22,t2,order[lVar21 + -1],order[lVar18 + -1],xs[s[iVar12]],
                              ys[iVar12],acc);
          __ptr_00[lVar18 + -1].deg = 0;
          __ptr_00[lVar21 + -1].deg = (int)TVar22._0_8_;
          __ptr_00[lVar21 + -1].length = (int)(TVar22._0_8_ >> 0x20);
          __ptr_00[lVar21 + -1].branch = TVar22.branch;
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      uVar14._0_4_ = __ptr_00->deg;
      uVar14._4_4_ = __ptr_00->length;
      __ptr = __ptr_00->branch;
      TVar22 = *__ptr_00;
      free(__ptr_00);
      if ((int)uStack_3ec18 < (int)uVar14._4_4_) {
        if (EARLY_QUIT_CRITERIA <= *best_round - rounds) {
          if (__ptr != (Branch *)0x0) {
            free(__ptr);
          }
          break;
        }
      }
      else {
        if ((int)uStack_3ec18 != uVar14._4_4_) {
          if (pBStack_3ec20 != (Branch *)0x0) {
            free(pBStack_3ec20);
          }
          uStack_3ec18 = uVar14 >> 0x20;
          pBStack_3ec20 = __ptr;
          uStack_3ebdc = (undefined4)uVar14;
        }
        *best_round = rounds;
      }
      if (rounds != 0) {
        if (0 < d) {
          memcpy(y,ys,__n);
          uVar14 = 0;
          do {
            x[uVar14] = xs[s[uVar14]];
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
        }
        *min_node1 = edges[0];
        *min_node2 = edges[1];
        update_dist2(TVar22,dist,iStack_3ebf4,edges,min_node1,min_node2,nb);
      }
      if (pBStack_3ec20 != __ptr && __ptr != (Branch *)0x0) {
        free(__ptr);
      }
      bVar8 = 0 < rounds;
      rounds = rounds + -1;
    } while (bVar8);
  }
  if (-1 < d) {
    uVar17 = 0;
    do {
      pdVar9 = ht[uVar17]->first;
      while (pdVar9 != (dl_el *)0x0) {
        pdVar5 = pdVar9->next;
        free(pdVar9[1].next);
        pdVar9 = pdVar5;
      }
      dl_clear(ht[uVar17]);
      free(ht[uVar17]);
      ht[uVar17] = (dl_t)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 != d + 1);
  }
  TVar23._0_8_ = (ulong)uStack_3ebdc | uStack_3ec18 << 0x20;
  TVar23.branch = pBStack_3ec20;
  return TVar23;
}

Assistant:

Tree flute_mr(int d, DTYPE *xs, DTYPE *ys, int *s,
	      int acc, int rounds, DTYPE **dist,
	      DTYPE *threshold_x, DTYPE *threshold_y,
	      DTYPE *threshold, 
	      int *best_round,
	      int *min_node1, int *min_node2,
	      int **nb)
{
  int i, j, k, m, n, itr, node1, node2;
  DTYPE min_dist, longest;
  DTYPE dist1, dist2;
  Tree t, best_t, *subtree, ttmp;
  DTYPE min_x, max_x;

#if MR_FOR_SMALL_CASES_ONLY
  int num_subtree, subroot[MAXPART], suproot[MAXPART], isSuperRoot[D2M];
  int tree_id[D2M], tid, tree_size[D2M], edges[2*D2M];
  int idx[MAXPART], offset[MAXPART], *order[MAXT], order_base[MAXT*D2M];
  DTYPE x[D2M+MAXPART], y[D2M+MAXPART];
  int new_s[D2M+MAXPART], si[D2M], xmap[D2M+MAXPART];
#else
  int num_subtree, *subroot, *suproot, *isSuperRoot;
  int *tree_id, tid, *tree_size, *edges;
  int *idx, *offset, **order, *order_base;
  DTYPE *x, *y;
  int *new_s, *si, *xmap;

  subroot = (int*)malloc(sizeof(int)*MAXPART);
  suproot = (int*)malloc(sizeof(int)*MAXPART);
  idx = (int*)malloc(sizeof(int)*MAXPART);
  offset = (int*)malloc(sizeof(int)*MAXPART);
  order = (int**)malloc(sizeof(int*)*MAXT);

  isSuperRoot = (int*)malloc(sizeof(int)*d);
  tree_id = (int*)malloc(sizeof(int)*d);
  tree_size = (int*)malloc(sizeof(int)*d);
  edges = (int*)malloc(sizeof(int)*d*2);
  order_base = (int*)malloc(sizeof(int)*d*MAXT);
  new_s = (int*)malloc(sizeof(int)*(d+MAXPART));
  si = (int*)malloc(sizeof(int)*d);
  xmap = (int*)malloc(sizeof(int)*(d+MAXPART));
  x = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
  y = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
#endif

#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      ht[i] = dl_alloc();
    }
  }
#endif

  best_t.branch = NULL;
  best_t.length = INFNTY;

  for (i=0; i<MAXT; i++) {
    //order[i] = &(order_base[i*D2(acc)]);
    order[i] = &(order_base[i*d]);
  }

  while (rounds>=0) {
    for (i=0; i<d; i++) {
      x[i] = xs[s[i]];
      y[i] = ys[i];
      isSuperRoot[i] = 0;
    }

    if (rounds==FIRST_ROUND) {
      build_rmst((long)d, x, y, edges, tree_id);
      for (i=0; i<d; i++) dist[i][i]=0;
    } else {
      mst_from_heap(d, dist, *min_node1, *min_node2, nb, edges, tree_id);
    }

    if (rounds!=0) {
      longest = 0;
      for (i=0; i<d; i++) {
	init_queue(nb[i]);
      }
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (rounds!=0) {
	enqueue(&nb[node1], node2);
	enqueue(&nb[node2], node1);
	dist[node1][node2] = dist[node2][node1] =
	  ADIFF(x[node1], x[node2]) + ADIFF(y[node1], y[node2]);
	if (longest < dist[node1][node2]) {
	  longest = dist[node1][node2];
	}
      }
    }

    for (i=0; i<d; i++) {
      tree_size[i] = 1;  // the node itself
    }

    suproot[0] = subroot[0] = edges[0];
    num_subtree=1;

    for (i=2*d-3; i>=0; ) {
      node2 = edges[i--];
      node1 = edges[i--];
      j = tree_size[node1]+tree_size[node2];
      //Chris
      if (j >= TAU(acc)) {
	isSuperRoot[node1] = 1;
	suproot[num_subtree] = node1;
	subroot[num_subtree++] = node2;
      } else {
	tree_size[node1] = j;
      }
    }

    //assert(num_subtree<=MAXT);

    for (i=1; i<num_subtree; i++) {
      tree_id[subroot[i]] = i+1;
      tree_size[subroot[i]] += 1;  // to account for the link to parent tree
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (tree_id[node2]==1) { // non-root node
	tree_id[node2] = tree_id[node1];
      }
    }

    // Find inverse si[] of s[]
    for (i=0; i<d; i++)
      si[s[i]] = i;

    offset[1] = 0;
    for (i=1; i<num_subtree; i++) {
      offset[i+1] = offset[i] + tree_size[subroot[i-1]];
    }
    //assert(offset[num_subtree]==d+num_subtree-1-tree_size[subroot[num_subtree-1]]);

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[si[i]];
      j = idx[tid]++;
      x[offset[tid]+j] = xs[i];
      xmap[i] = j;

      if (isSuperRoot[si[i]]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==si[i]) {
	    tid = k+1;
	    j = idx[tid]++;
	    x[offset[tid]+j] = xs[i];
	    xmap[d-1+tid] = j;
	  }
	}
      }
    }

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[i];
      j = idx[tid]++;
      y[offset[tid]+j] = ys[i];
      new_s[offset[tid]+j] = xmap[s[i]];
      order[tid-1][j] = i;

      if (isSuperRoot[i]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==i) {
	    tid = k+1;
	    j = idx[tid]++;
	    y[offset[tid]+j] = ys[i];
	    new_s[offset[tid]+j] = xmap[d-1+tid];
	    order[tid-1][j] = i;
	  }
	}
      }
    }

    subtree = (Tree*)malloc(num_subtree*sizeof(Tree));
    for (i=1; i<=num_subtree; i++) {
      if (tree_size[subroot[i-1]] <= 1) {
	subtree[i-1].deg = 0;
	continue;
      }

      t = flutes_c(tree_size[subroot[i-1]], x+offset[i], y+offset[i],
		   new_s+offset[i], acc);
    
      subtree[i-1] = t;
    }


    for (i=1; i<num_subtree; i++) {
      //assert(tree_id[suproot[i]] != tree_id[subroot[i]]);

      t = wmergetree(subtree[tree_id[suproot[i]]-1],
		     subtree[tree_id[subroot[i]]-1],
		     order[tree_id[suproot[i]]-1],
		     order[tree_id[subroot[i]]-1],
		     xs[s[suproot[i]]], ys[suproot[i]], acc);

      subtree[tree_id[subroot[i]]-1].deg = 0;
      subtree[tree_id[suproot[i]]-1] = t;
    }

    t = subtree[0];
    free(subtree);
  
    if (best_t.length < t.length) {
      if (*best_round-rounds >= EARLY_QUIT_CRITERIA) {
	if (t.branch) {
	  free(t.branch);
	}
	break;
      }
    } else if (best_t.length == t.length) {
      *best_round = rounds;
    } else if (best_t.length > t.length) {
      if (best_t.branch) {
	free(best_t.branch);
      }
      best_t = t;
      *best_round = rounds;
    }

    if (rounds > 0) {
      for (i=0; i<d; i++) {
	x[i] = xs[s[i]];
	y[i] = ys[i];
      }

      *min_node1 = edges[0];
      *min_node2 = edges[1];

      update_dist2(t, dist, longest, edges, min_node1, min_node2, nb);
    }

    if (t.branch != 0 && best_t.branch != t.branch) {
      free(t.branch);
    }

    rounds--;
  }
  
#if !(MR_FOR_SMALL_CASES_ONLY)
  free(subroot); free(suproot); free(idx); free(offset); free(order);
  free(isSuperRoot); free(tree_id); free(tree_size); free(edges);
  free(order_base); free(new_s); free(si); free(xmap); free(x); free(y);
#endif
  
#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      dl_forall(Tree, ht[i], ttmp) {
	free(ttmp.branch);
      } dl_endfor;
      dl_free(ht[i]);
    }
  }
#endif
  
  return best_t;
}